

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

BaseState<true> * __thiscall
DefaultState<true>::Key
          (DefaultState<true> *this,Context<true> *ctx,char *str,SizeType length,bool param_5)

{
  int iVar1;
  stringstream *psVar2;
  ostream *poVar3;
  uint in_ECX;
  char *in_RDX;
  long in_RSI;
  Context<true> *in_RDI;
  DefaultState<true> *in_stack_fffffffffffffff8;
  
  *(char **)(in_RSI + 0x10) = in_RDX;
  *(uint *)(in_RSI + 0x18) = in_ECX;
  if ((in_ECX != 0) && (*in_RDX == '_')) {
    if ((*(uint *)(in_RSI + 0x18) < 6) || (iVar1 = strncmp(in_RDX,"_label",6), iVar1 != 0)) {
      if ((*(int *)(in_RSI + 0x18) == 5) && (iVar1 = strcmp(in_RDX,"_text"), iVar1 == 0)) {
        in_RDI = (Context<true> *)(in_RSI + 0xf0);
      }
      else if ((*(int *)(in_RSI + 0x18) == 6) && (iVar1 = strcmp(in_RDX,"_multi"), iVar1 == 0)) {
        in_RDI = (Context<true> *)(in_RSI + 0x110);
      }
      else if ((*(int *)(in_RSI + 0x18) == 4) &&
              (iVar1 = strcasecmp(*(char **)(in_RSI + 0x10),"_tag"), iVar1 == 0)) {
        in_RDI = (Context<true> *)(in_RSI + 0x100);
      }
      else {
        in_RDI = (Context<true> *)
                 Ignore(in_stack_fffffffffffffff8,in_RDI,(SizeType)((ulong)in_RSI >> 0x20));
      }
    }
    else if ((*(uint *)(in_RSI + 0x18) < 7) || (*(char *)(*(long *)(in_RSI + 0x10) + 6) != '_')) {
      if (*(int *)(in_RSI + 0x18) == 6) {
        in_RDI = (Context<true> *)(in_RSI + 0x88);
      }
      else if ((*(int *)(in_RSI + 0x18) == 0xb) &&
              (iVar1 = strcasecmp(in_RDX,"_labelIndex"), iVar1 == 0)) {
        in_RDI = (Context<true> *)(in_RSI + 0xd8);
      }
      else {
        psVar2 = Context<true>::error_abi_cxx11_(in_RDI);
        poVar3 = std::operator<<((ostream *)(psVar2 + 0x10),"Unsupported key \'");
        poVar3 = std::operator<<(poVar3,in_RDX);
        poVar3 = std::operator<<(poVar3,"\' len: ");
        std::ostream::operator<<(poVar3,in_ECX);
        in_RDI = (Context<true> *)0x0;
      }
    }
    else {
      in_RDI = (Context<true> *)(in_RSI + 200);
    }
  }
  return (BaseState<true> *)in_RDI;
}

Assistant:

BaseState<audit>* Key(Context<audit>& ctx, const char* str, rapidjson::SizeType length, bool)
  {
    ctx.key = str;
    ctx.key_length = length;

    if (length > 0 && str[0] == '_')
    {
      // match _label*
      if (ctx.key_length >= 6 && !strncmp(str, "_label", 6))
      {
        if (ctx.key_length >= 7 && ctx.key[6] == '_')
          return &ctx.label_single_property_state;
        else if (ctx.key_length == 6)
          return &ctx.label_state;
        else if (ctx.key_length == 11 && !_stricmp(str, "_labelIndex"))
          return &ctx.label_index_state;
        else
        {
          ctx.error() << "Unsupported key '" << str << "' len: " << length;
          return nullptr;
        }
      }

      if (ctx.key_length == 5 && !strcmp(str, "_text"))
        return &ctx.text_state;

      // TODO: _multi in _multi...
      if (ctx.key_length == 6 && !strcmp(str, "_multi"))
        return &ctx.multi_state;

      if (ctx.key_length == 4 && !_stricmp(ctx.key, "_tag"))
        return &ctx.tag_state;

      return Ignore(ctx, length);
    }

    return this;
  }